

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

bool __thiscall
CDBWrapper::Read<std::__cxx11::string,uint256>
          (CDBWrapper *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          uint256 *value)

{
  long lVar1;
  bool bVar2;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  exception *anon_var_0;
  DataStream ssValue;
  DataStream ssKey;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strValue;
  DataStream *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  DataStream *this_00;
  byte *in_stack_ffffffffffffff30;
  CDBWrapper *in_stack_ffffffffffffff88;
  DataStream local_58;
  Span<const_std::byte> in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &local_58;
  DataStream::DataStream(in_stack_ffffffffffffff08);
  DataStream::reserve(in_stack_ffffffffffffff08,0x5b1b99);
  DataStream::operator<<
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             (DataStream *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ReadImpl_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffffd0);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff08);
  if (bVar2) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffff08);
    SVar3 = MakeByteSpan<std::__cxx11::string&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    SVar3.m_size = (size_t)SVar3.m_data;
    SVar3.m_data = in_stack_ffffffffffffff30;
    DataStream::DataStream(in_RDI,SVar3);
    DataStream::Xor(this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
    DataStream::operator>>
              ((DataStream *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               (uint256 *)in_stack_ffffffffffffff10);
    DataStream::~DataStream(in_stack_ffffffffffffff08);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffff08);
  DataStream::~DataStream(in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Read(const K& key, V& value) const
    {
        DataStream ssKey{};
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey << key;
        std::optional<std::string> strValue{ReadImpl(ssKey)};
        if (!strValue) {
            return false;
        }
        try {
            DataStream ssValue{MakeByteSpan(*strValue)};
            ssValue.Xor(obfuscate_key);
            ssValue >> value;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }